

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

RegexMatcher * __thiscall icu_63::RegexMatcher::reset(RegexMatcher *this,UnicodeString *input)

{
  UErrorCode *status_00;
  RuleBasedBreakIterator *pRVar1;
  UText *pUVar2;
  int64_t iVar3;
  UErrorCode status;
  
  status_00 = &this->fDeferredStatus;
  pUVar2 = utext_openConstUnicodeString_63(this->fInputText,input,status_00);
  this->fInputText = pUVar2;
  if (this->fPattern->fNeedsAltInput != '\0') {
    pUVar2 = utext_clone_63(this->fAltInputText,pUVar2,'\0','\x01',status_00);
    this->fAltInputText = pUVar2;
  }
  if (*status_00 < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = utext_nativeLength_63(this->fInputText);
    this->fInputLength = iVar3;
    this->fRegionStart = 0;
    this->fRegionLimit = iVar3;
    this->fActiveStart = 0;
    this->fActiveLimit = iVar3;
    this->fAnchorStart = 0;
    this->fAnchorLimit = iVar3;
    this->fLookStart = 0;
    this->fLookLimit = iVar3;
    this->fMatchStart = 0;
    this->fMatchEnd = 0;
    this->fLastMatchEnd = -1;
    this->fAppendPosition = 0;
    this->fMatch = '\0';
    this->fHitEnd = '\0';
    this->fRequireEnd = '\0';
    this->fTime = 0;
    this->fTickCounter = 10000;
    if (this->fInput != (UnicodeString *)0x0) {
      (*(this->fInput->super_Replaceable).super_UObject._vptr_UObject[1])();
    }
    this->fInput = (UnicodeString *)0x0;
    this->fInputUniStrMaybeMutable = '\x01';
    pRVar1 = this->fWordBreakItr;
    if (pRVar1 != (RuleBasedBreakIterator *)0x0) {
      (*(pRVar1->super_BreakIterator).super_UObject._vptr_UObject[8])(pRVar1,this->fInputText);
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset(const UnicodeString &input) {
    fInputText = utext_openConstUnicodeString(fInputText, &input, &fDeferredStatus);
    if (fPattern->fNeedsAltInput) {
        fAltInputText = utext_clone(fAltInputText, fInputText, FALSE, TRUE, &fDeferredStatus);
    }
    if (U_FAILURE(fDeferredStatus)) {
        return *this;
    }
    fInputLength = utext_nativeLength(fInputText);

    reset();
    delete fInput;
    fInput = NULL;

    //  Do the following for any UnicodeString.
    //  This is for compatibility for those clients who modify the input string "live" during regex operations.
    fInputUniStrMaybeMutable = TRUE;

    if (fWordBreakItr != NULL) {
#if UCONFIG_NO_BREAK_ITERATION==0
        UErrorCode status = U_ZERO_ERROR;
        fWordBreakItr->setText(fInputText, status);
#endif
    }
    return *this;
}